

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vgmplayer_cmdhandler.cpp
# Opt level: O3

void __thiscall VGMPlayer::Cmd_DataBlock(VGMPlayer *this)

{
  byte bVar1;
  UINT8 UVar2;
  uint uVar3;
  iterator iVar4;
  void *pvVar5;
  uint uVar6;
  CHIP_DEVICE *pCVar7;
  uint uVar8;
  uint *puVar9;
  long lVar10;
  int iVar11;
  long lVar12;
  byte chipID;
  PCM_BANK *this_00;
  uint inLen;
  ulong uVar13;
  UINT8 *pUVar14;
  UINT32 oldLen;
  PCM_CDB_INF dbCI;
  uint local_60;
  uint local_5c;
  UINT32 local_58;
  UINT32 local_54;
  PCM_CDB_INF local_50;
  CHIP_DEVICE *local_38;
  
  pUVar14 = this->_fileData;
  uVar6 = this->_filePos;
  bVar1 = pUVar14[(ulong)uVar6 + 2];
  uVar8 = (uint)bVar1;
  uVar3 = *(uint *)(pUVar14 + (ulong)uVar6 + 3);
  inLen = uVar3 & 0x7fffffff;
  uVar6 = uVar6 + 7;
  this->_filePos = uVar6;
  if (bVar1 >> 6 < 2) {
    if (uVar8 == 0x7f) {
      ReadPCMComprTable(inLen,pUVar14 + uVar6,&this->_pcmComprTbl);
    }
    else {
      uVar8 = uVar8 & 0x3f;
      this_00 = this->_pcmBank + uVar8;
      local_60 = *(int *)&this->_pcmBank[uVar8].data.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                 *(int *)&(this_00->data).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
      pUVar14 = pUVar14 + uVar6;
      local_5c = inLen;
      if ((bVar1 & 0x40) == 0) {
        iVar4._M_current =
             this->_pcmBank[uVar8].bankOfs.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            this->_pcmBank[uVar8].bankOfs.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     &this->_pcmBank[uVar8].bankOfs,iVar4,&local_60);
        }
        else {
          *iVar4._M_current = local_60;
          this->_pcmBank[uVar8].bankOfs.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        iVar4._M_current =
             this->_pcmBank[uVar8].bankSize.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            this->_pcmBank[uVar8].bankSize.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     &this->_pcmBank[uVar8].bankSize,iVar4,&local_5c);
        }
        else {
          *iVar4._M_current = local_5c;
          this->_pcmBank[uVar8].bankSize.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&this_00->data,(ulong)(local_5c + local_60));
        memcpy((this_00->data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start + local_60,pUVar14,(ulong)local_5c);
      }
      else {
        ReadComprDataBlkHdr(inLen,pUVar14,&local_50);
        local_50.cmprInfo.comprTbl = &this->_pcmComprTbl;
        local_5c = local_50.decmpLen;
        iVar4._M_current =
             this->_pcmBank[uVar8].bankOfs.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            this->_pcmBank[uVar8].bankOfs.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     &this->_pcmBank[uVar8].bankOfs,iVar4,&local_60);
        }
        else {
          *iVar4._M_current = local_60;
          this->_pcmBank[uVar8].bankOfs.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        iVar4._M_current =
             this->_pcmBank[uVar8].bankSize.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            this->_pcmBank[uVar8].bankSize.
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                     &this->_pcmBank[uVar8].bankSize,iVar4,&local_5c);
        }
        else {
          *iVar4._M_current = local_5c;
          this->_pcmBank[uVar8].bankSize.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar4._M_current + 1;
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  (&this_00->data,(ulong)(local_5c + local_60));
        DecompressDataBlk(local_5c,(this_00->data).
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start + local_60,
                          inLen - local_50.hdrSize,pUVar14 + local_50.hdrSize,&local_50.cmprInfo);
      }
    }
    goto LAB_00123544;
  }
  chipID = (byte)(uVar3 >> 0x1f);
  if (bVar1 >> 6 == 2) {
    uVar8 = uVar8 & 0x3f;
    UVar2 = _VGM_ROM_CHIPS[uVar8][0];
    local_38 = GetDevicePtr(this,UVar2,chipID);
    if (local_38 != (CHIP_DEVICE *)0x0) {
      pUVar14 = this->_fileData;
      uVar13 = (ulong)this->_filePos;
      local_58 = *(UINT32 *)(pUVar14 + uVar13);
      local_54 = *(UINT32 *)(pUVar14 + uVar13 + 4);
      uVar6 = inLen - 8;
      if (((UVar2 == '\x1c') && (uVar6 != 0)) && ((local_38->flags & 1) != 0)) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_50,(ulong)uVar6,
                   (allocator_type *)&local_60);
        lVar10 = 0;
        do {
          *(UINT8 *)(CONCAT44(local_50.decmpLen,local_50.hdrSize) + lVar10) =
               pUVar14[lVar10 + uVar13 + 9];
          *(UINT8 *)(CONCAT44(local_50.decmpLen,local_50.hdrSize) + 1 + lVar10) =
               pUVar14[lVar10 + uVar13 + 8];
          lVar10 = lVar10 + 2;
        } while ((uint)lVar10 < uVar6);
        WriteChipROM(local_38,_VGM_ROM_CHIPS[uVar8][1],local_58,local_54,uVar6,
                     (UINT8 *)CONCAT44(local_50.decmpLen,local_50.hdrSize));
        pvVar5 = (void *)CONCAT44(local_50.decmpLen,local_50.hdrSize);
        if (pvVar5 != (void *)0x0) {
          operator_delete(pvVar5,(long)local_50.cmprInfo.comprTbl - (long)pvVar5);
        }
      }
      else {
        WriteChipROM(local_38,_VGM_ROM_CHIPS[uVar8][1],local_58,local_54,uVar6,pUVar14 + uVar13 + 8)
        ;
      }
    }
    goto LAB_00123544;
  }
  UVar2 = _VGM_RAM_CHIPS[bVar1 & 0x3f];
  pCVar7 = GetDevicePtr(this,UVar2,chipID);
  if ((pCVar7 == (CHIP_DEVICE *)0x0) || (pCVar7->romWrite == (DEVFUNC_WRITE_BLOCK)0x0))
  goto LAB_00123544;
  puVar9 = (uint *)(this->_fileData + this->_filePos);
  if ((bVar1 & 0x20) == 0) {
    uVar6 = (uint)(ushort)*puVar9;
    lVar10 = 2;
    iVar11 = -2;
  }
  else {
    uVar6 = *puVar9;
    lVar10 = 4;
    iVar11 = -4;
  }
  if (UVar2 == '\x05') {
    lVar12 = 0x355c;
LAB_00123531:
    uVar6 = uVar6 | (uint)*(byte *)((long)&(this->super_PlayerBase)._vptr_PlayerBase +
                                   (ulong)(uVar3 >> 0x1f) + lVar12) << 0xc;
  }
  else if (UVar2 == '\x10') {
    lVar12 = 0x355e;
    goto LAB_00123531;
  }
  (*pCVar7->romWrite)((pCVar7->base).defInf.dataPtr,uVar6,iVar11 + inLen,
                      (UINT8 *)((long)puVar9 + lVar10));
LAB_00123544:
  this->_filePos = this->_filePos + inLen;
  return;
}

Assistant:

void VGMPlayer::Cmd_DataBlock(void)
{
	UINT8 dblkType;
	UINT8 chipType;
	UINT8 chipID;
	UINT32 dblkLen;
	UINT32 memSize;
	UINT32 dataOfs;
	UINT32 dataLen;
	const UINT8* dataPtr;
	CHIP_DEVICE* cDev;
	
	dblkType = fData[0x02];
	dblkLen = ReadLE32(&fData[0x03]);
	chipID = (dblkLen & 0x80000000) >> 31;
	dblkLen &= 0x7FFFFFFF;
	_filePos += 0x07;
	
	switch(dblkType & 0xC0)
	{
	case 0x00:	// uncompressed data block
	case 0x40:	// compressed data block
		if (dblkType == 0x7F)
		{
			ReadPCMComprTable(dblkLen, &fData[0x00], &_pcmComprTbl);
		}
		else
		{
			PCM_BANK* pcmBnk = &_pcmBank[dblkType & 0x3F];
			PCM_CDB_INF dbCI;
			UINT32 oldLen = (UINT32)pcmBnk->data.size();
			dataLen = dblkLen;
			dataPtr = &fData[0x00];
			
			if (dblkType & 0x40)
			{
				ReadComprDataBlkHdr(dblkLen, dataPtr, &dbCI);
				dbCI.cmprInfo.comprTbl = &_pcmComprTbl;
				dataLen = dbCI.decmpLen;
			}
			
			pcmBnk->bankOfs.push_back(oldLen);
			pcmBnk->bankSize.push_back(dataLen);
			
			pcmBnk->data.resize(oldLen + dataLen);
			if (dblkType & 0x40)
			{
				DecompressDataBlk(dataLen, &pcmBnk->data[oldLen],
									dblkLen - dbCI.hdrSize, &dataPtr[dbCI.hdrSize], &dbCI.cmprInfo);
			}
			else
			{
				memcpy(&pcmBnk->data[oldLen], dataPtr, dataLen);
			}
			
			// TODO: refresh DAC Stream pointers
		}
		break;
	case 0x80:	// ROM/RAM write
		chipType = _VGM_ROM_CHIPS[dblkType & 0x3F][0];
		cDev = GetDevicePtr(chipType, chipID);
		if (cDev == NULL)
			break;
		
		memSize = ReadLE32(&fData[0x00]);
		dataOfs = ReadLE32(&fData[0x04]);
		dataPtr = &fData[0x08];
		dataLen = dblkLen - 0x08;
		if (chipType == 0x1C && dataLen && (cDev->flags & 0x01))
		{
			// chip == ASIC 219 (ID 0x1C + flags 0x01): byte-swap sample data
			std::vector<UINT8> swpData(dataLen);
			for (UINT32 curPos = 0x00; curPos < dataLen; curPos += 0x02)
			{
				swpData[curPos + 0x00] = dataPtr[curPos + 0x01];
				swpData[curPos + 0x01] = dataPtr[curPos + 0x00];
			}
			WriteChipROM(cDev, _VGM_ROM_CHIPS[dblkType & 0x3F][1], memSize, dataOfs, dataLen, &swpData[0x00]);
		}
		else
		{
			WriteChipROM(cDev, _VGM_ROM_CHIPS[dblkType & 0x3F][1], memSize, dataOfs, dataLen, dataPtr);
		}
		break;
	case 0xC0:	// RAM Write
		chipType = _VGM_RAM_CHIPS[dblkType & 0x3F];
		cDev = GetDevicePtr(chipType, chipID);
		if (cDev == NULL || cDev->romWrite == NULL)
			break;
		
		if (! (dblkType & 0x20))
		{
			// C0..DF: 16-bit addressing
			dataOfs = ReadLE16(&fData[0x00]);
			dataLen = dblkLen - 0x02;
			dataPtr = &fData[0x02];
		}
		else
		{
			// E0..FF: 32-bit addressing
			dataOfs = ReadLE32(&fData[0x00]);
			dataLen = dblkLen - 0x04;
			dataPtr = &fData[0x04];
		}
		DoRAMOfsPatches(chipType, chipID, dataOfs, dataLen);
		cDev->romWrite(cDev->base.defInf.dataPtr, dataOfs, dataLen, dataPtr);
		break;
	}
	
	_filePos += dblkLen;
	return;
}